

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

FiniteAutomaton *
Omega_h::FiniteAutomaton::make_range_nfa
          (FiniteAutomaton *__return_storage_ptr__,int nsymbols,int range_start,int range_end,
          int token)

{
  int from_state;
  int state;
  char *pcVar1;
  int i;
  undefined8 uStack_40;
  
  if (range_start < 0) {
    pcVar1 = "0 <= range_start";
    uStack_40 = 0x7d;
  }
  else if (range_end < range_start) {
    pcVar1 = "range_start <= range_end";
    uStack_40 = 0x7e;
  }
  else {
    if (range_end <= nsymbols) {
      FiniteAutomaton(__return_storage_ptr__,nsymbols,true,2);
      from_state = add_state(__return_storage_ptr__);
      state = add_state(__return_storage_ptr__);
      for (; range_start <= range_end; range_start = range_start + 1) {
        add_transition(__return_storage_ptr__,from_state,range_start,state);
      }
      add_accept(__return_storage_ptr__,state,token);
      return __return_storage_ptr__;
    }
    pcVar1 = "range_end <= nsymbols";
    uStack_40 = 0x7f;
  }
  fail("assertion %s failed at %s +%d\n",pcVar1,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,uStack_40);
}

Assistant:

FiniteAutomaton FiniteAutomaton::make_range_nfa(
    int nsymbols, int range_start, int range_end, int token) {
  OMEGA_H_CHECK(0 <= range_start);
  OMEGA_H_CHECK(range_start <= range_end);
  OMEGA_H_CHECK(range_end <= nsymbols);
  FiniteAutomaton out(nsymbols, true, 2);
  auto start_state = add_state(out);
  auto accept_state = add_state(out);
  for (int i = range_start; i <= range_end; ++i) {
    add_transition(out, start_state, i, accept_state);
  }
  add_accept(out, accept_state, token);
  return out;
}